

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool Grammar::is_spaces(string *str)

{
  string local_30;
  
  str_utils::ltrim(&local_30,str);
  std::__cxx11::string::~string((string *)&local_30);
  return local_30._M_string_length == 0;
}

Assistant:

bool Grammar::is_spaces(const std::string& str) {
    return str_utils::ltrim(str).size() == 0;
}